

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

SRes LzmaEnc_CodeOneBlock(CLzmaEnc *p,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  CRangeEnc *p_00;
  UInt64 *pUVar1;
  uint *puVar2;
  COptimal *pCVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  short sVar7;
  CLzmaEnc *pCVar8;
  CLzmaProb (*paCVar9) [16];
  CLzmaProb (*paCVar10) [64];
  UInt32 UVar11;
  UInt32 UVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  SRes SVar16;
  Byte *pBVar17;
  Byte *pBVar18;
  Byte *pBVar19;
  byte *pbVar20;
  UInt64 UVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  UInt32 *pUVar25;
  uint uVar26;
  uint uVar27;
  CLzmaEnc *pCVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  CProbPrice CVar36;
  Byte *pBVar37;
  long lVar38;
  COptimal *pCVar39;
  ulong uVar40;
  ulong uVar41;
  uint m;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  CLzmaProb *pCVar46;
  ulong uVar47;
  ulong uVar48;
  bool bVar49;
  uint numPairs_1;
  uint numPairs;
  uint repLens [4];
  uint local_18c;
  uint local_188 [3];
  UInt32 local_17c;
  ulong local_170;
  CProbPrice *local_168;
  uint local_160;
  uint local_15c;
  ulong local_158;
  CLzmaEnc *local_150;
  Byte *local_148;
  ulong local_140;
  ulong local_138;
  UInt32 local_130;
  uint local_12c;
  uint local_128;
  int local_124;
  ulong local_120;
  ulong local_118;
  CLzmaProb (*local_110) [16];
  CLzmaProb (*local_108) [16];
  long local_100;
  ulong local_f8;
  UInt32 (*local_f0) [272];
  uint local_e8;
  UInt32 local_e4;
  ulong local_e0;
  uint local_d8 [4];
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  UInt32 local_b0;
  CProbPrice local_ac;
  UInt32 local_a8;
  UInt32 local_a4;
  CLenEnc *local_a0;
  CLenEnc *local_98;
  UInt32 (*local_90) [128];
  UInt32 (*local_88) [64];
  UInt32 (*local_80) [272];
  ulong local_78;
  uint *local_70;
  ushort *local_68;
  ulong local_60;
  CLenPriceEnc *local_58;
  CLzmaProb *local_50;
  CLenPriceEnc *local_48;
  Byte *local_40;
  CLzmaProb (*local_38) [64];
  
  local_e4 = maxPackSize;
  local_a4 = maxUnpackSize;
  if (p->needInit != 0) {
    (*(p->matchFinder).Init)(p->matchFinderObj);
    p->needInit = 0;
  }
  if (p->finished != 0 || p->result != 0) {
    return p->result;
  }
  if ((p->rc).res == 0) {
    if ((p->matchFinderBase).result == 0) {
      local_b8 = p->nowPos64;
      uVar48 = local_b8 & 0xffffffff;
      pCVar28 = p;
      local_150 = p;
      if (local_b8 == 0) {
        UVar11 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
        if (UVar11 == 0) {
          UVar11 = (UInt32)local_b8;
          goto LAB_0019ccae;
        }
        ReadMatchDistances(p,local_188);
        uVar6 = p->isMatch[0][0];
        uVar26 = ((p->rc).range >> 0xb) * (uint)uVar6;
        p->isMatch[0][0] = (short)(0x800 - uVar6 >> 5) + uVar6;
        if (uVar26 < 0x1000000) {
          uVar26 = uVar26 * 0x100;
          RangeEnc_ShiftLow(&p->rc);
        }
        pCVar28 = local_150;
        (local_150->rc).range = uVar26;
        pBVar17 = (*(local_150->matchFinder).GetPointerToCurrentPos)(local_150->matchFinderObj);
        LitEnc_Encode(&p->rc,pCVar28->litProbs,(uint)pBVar17[-(ulong)pCVar28->additionalOffset]);
        pCVar28->additionalOffset = pCVar28->additionalOffset - 1;
        uVar48 = 1;
      }
      UVar11 = (UInt32)uVar48;
      UVar12 = (*(pCVar28->matchFinder).GetNumAvailableBytes)(pCVar28->matchFinderObj);
      p = pCVar28;
      if (UVar12 != 0) {
        local_70 = &pCVar28->numPairs;
        local_168 = pCVar28->ProbPrices;
        local_108 = pCVar28->isMatch;
        local_110 = pCVar28->isRep0Long;
        local_f0 = (pCVar28->repLenEnc).prices;
        local_80 = (pCVar28->lenEnc).prices;
        local_88 = pCVar28->posSlotPrices;
        local_90 = pCVar28->distancesPrices;
        p_00 = &pCVar28->rc;
        local_98 = &pCVar28->lenProbs;
        local_38 = pCVar28->posSlotEncoder;
        local_50 = pCVar28->posEncoders;
        local_a0 = &pCVar28->repLenProbs;
        local_48 = &pCVar28->lenEnc;
        local_58 = &pCVar28->repLenEnc;
        local_40 = (Byte *)(ulong)local_e4;
        do {
          do {
            uVar26 = (uint)uVar48;
            if (p->fastMode == 0) {
              uVar42 = p->optCur;
              if (p->optEnd == uVar42) {
                p->optCur = 0;
                p->optEnd = 0;
                if (p->additionalOffset == 0) {
                  uVar42 = ReadMatchDistances(p,&local_18c);
                }
                else {
                  uVar42 = p->longestMatchLen;
                  local_18c = p->numPairs;
                }
                uVar14 = p->numAvail;
                if (uVar14 < 2) {
LAB_0019ab02:
                  p->backRes = 0xffffffff;
                  uVar14 = 1;
                }
                else {
                  uVar23 = 0x111;
                  if (uVar14 < 0x111) {
                    uVar23 = uVar14;
                  }
                  pBVar17 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                  paCVar9 = local_108;
                  bVar5 = pBVar17[-1];
                  if (uVar23 < 4) {
                    uVar23 = 3;
                  }
                  lVar24 = 0;
                  uVar27 = 0;
                  do {
                    uVar43 = p->reps[lVar24];
                    local_188[lVar24] = uVar43;
                    if ((bVar5 == pBVar17[~(ulong)uVar43]) &&
                       (lVar34 = -(ulong)uVar43, *pBVar17 == pBVar17[lVar34])) {
                      if (uVar14 == 2) {
                        local_d8[lVar24] = 2;
                        if (local_d8[uVar27] < 2) {
                          uVar27 = (uint)lVar24;
                        }
                      }
                      else {
                        uVar40 = 2;
                        do {
                          uVar33 = uVar40;
                          if (pBVar17[uVar40 - 1] != pBVar17[uVar40 + lVar34 + -1]) break;
                          uVar40 = uVar40 + 1;
                          uVar33 = (ulong)uVar23;
                        } while (uVar23 != uVar40);
                        uVar43 = (uint)uVar33;
                        local_d8[lVar24] = uVar43;
                        if (local_d8[uVar27] < uVar43) {
                          uVar27 = (uint)lVar24;
                        }
                        if (uVar43 == 0x111) break;
                      }
                    }
                    else {
                      local_d8[lVar24] = 0;
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 4);
                  uVar14 = local_d8[uVar27];
                  if (uVar14 < p->numFastBytes) {
                    if (uVar42 < p->numFastBytes) {
                      local_e0 = (ulong)local_188[0];
                      bVar4 = pBVar17[~local_e0];
                      if (uVar14 <= uVar42) {
                        uVar14 = uVar42;
                      }
                      uVar40 = (ulong)uVar14;
                      if ((uVar14 < 2) && (bVar5 != bVar4)) goto LAB_0019ab02;
                      uVar45 = (ulong)p->state;
                      p->opt[0].state = (CState)p->state;
                      uVar33 = (ulong)(p->pbMask & uVar26);
                      CVar36 = p->ProbPrices[local_108[uVar45][uVar33] >> 4];
                      if (uVar45 < 7) {
                        UVar11 = 0;
                        uVar23 = bVar5 + 0x100;
                        do {
                          UVar11 = UVar11 + local_168[(-(uVar23 & 1) & 0x7f0 ^
                                                      (uint)*(ushort *)
                                                             ((long)(p->litProbs +
                                                                    ((((uint)pBVar17[-2] |
                                                                      uVar26 << 8) & p->lpMask) <<
                                                                    ((byte)p->lc & 0x1f)) * 3) +
                                                             (ulong)(uVar23 & 0xfffffffe))) >> 4];
                          bVar49 = 3 < uVar23;
                          uVar23 = uVar23 >> 1;
                        } while (bVar49);
                      }
                      else {
                        UVar11 = LitEnc_Matched_GetPrice
                                           (p->litProbs +
                                            ((((uint)pBVar17[-2] | uVar26 << 8) & p->lpMask) <<
                                            ((byte)p->lc & 0x1f)) * 3,(uint)bVar5,(uint)bVar4,
                                            local_168);
                      }
                      uVar23 = UVar11 + CVar36;
                      p->opt[1].price = uVar23;
                      p->opt[1].dist = 0xffffffff;
                      p->opt[1].extra = 0;
                      iVar29 = *(int *)((long)p->ProbPrices +
                                       (ulong)(paCVar9[uVar45][uVar33] >> 2 & 0xfffffffc ^ 0x1fc));
                      iVar22 = *(int *)((long)p->ProbPrices +
                                       (ulong)(p->isRep[uVar45] >> 2 & 0xfffffffc ^ 0x1fc)) + iVar29
                      ;
                      if (local_d8[0] == 0 && bVar5 == bVar4) {
                        uVar27 = p->ProbPrices[p->isRepG0[uVar45] >> 4] + iVar22 +
                                 p->ProbPrices[local_110[uVar45][uVar33] >> 4];
                        UVar11 = 0xffffffff;
                        if (uVar27 < uVar23) {
                          p->opt[1].price = uVar27;
                          p->opt[1].dist = 0;
                          p->opt[1].extra = 0;
                          UVar11 = 0;
                        }
                        if (uVar14 < 2) {
                          p->backRes = UVar11;
                          goto LAB_0019c094;
                        }
                      }
                      p->opt[1].len = 1;
                      p->opt[0].reps[0] = (UInt32)local_e0;
                      local_12c = local_188[1];
                      p->opt[0].reps[1] = local_188[1];
                      local_128 = local_188[2];
                      p->opt[0].reps[2] = local_188[2];
                      local_130 = local_17c;
                      p->opt[0].reps[3] = local_17c;
                      lVar24 = 0;
                      do {
                        uVar23 = local_d8[lVar24];
                        if (1 < uVar23) {
                          uVar27 = (uint)(p->isRepG0[uVar45] >> 4);
                          if (lVar24 == 0) {
                            CVar36 = *(CProbPrice *)
                                      ((long)local_168 +
                                      (ulong)(local_110[uVar45][uVar33] >> 2 & 0xfffffffc ^ 0x1fc));
LAB_0019b094:
                            iVar35 = CVar36 + local_168[uVar27];
                          }
                          else {
                            CVar36 = p->ProbPrices[uVar27 ^ 0x7f];
                            uVar27 = (uint)(p->isRepG1[uVar45] >> 4);
                            if (lVar24 == 1) goto LAB_0019b094;
                            iVar35 = CVar36 + p->ProbPrices[uVar27 ^ 0x7f] +
                                     p->ProbPrices
                                     [(2 - (UInt32)lVar24 & 0x7f0 ^ (uint)p->isRepG2[uVar45]) >> 4];
                          }
                          do {
                            uVar27 = local_f0[uVar33 - 1][(ulong)uVar23 + 0x10e] + iVar35 + iVar22;
                            if (uVar27 < pCVar28->opt[uVar23].price) {
                              pCVar39 = pCVar28->opt + uVar23;
                              pCVar39->price = uVar27;
                              pCVar39->len = uVar23;
                              pCVar39->dist = (UInt32)lVar24;
                              pCVar39->extra = 0;
                            }
                            uVar23 = uVar23 - 1;
                          } while (1 < uVar23);
                        }
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 4);
                      uVar23 = local_d8[0] + 1;
                      if (uVar23 <= uVar42) {
                        if (uVar23 < 2) {
                          uVar23 = 2;
                          uVar47 = 0;
                        }
                        else {
                          uVar47 = 0xfffffffe;
                          do {
                            uVar47 = (ulong)((int)uVar47 + 2);
                          } while (p->matches[uVar47] < uVar23);
                        }
                        CVar36 = p->ProbPrices[p->isRep[uVar45] >> 4];
                        while( true ) {
                          uVar42 = p->matches[uVar47 + 1];
                          iVar22 = local_80[uVar33 - 1][(ulong)uVar23 + 0x10e] + iVar29 + CVar36;
                          uVar45 = (ulong)(uVar23 - 2);
                          if (4 < uVar23) {
                            uVar45 = 3;
                          }
                          if ((ulong)uVar42 < 0x80) {
                            uVar27 = iVar22 + local_90[uVar45][uVar42];
                          }
                          else {
                            iVar35 = 6;
                            if (0xfffff < uVar42) {
                              iVar35 = 0x13;
                            }
                            uVar27 = iVar22 + local_150->alignPrices[uVar42 & 0xf] +
                                     local_88[uVar45]
                                     [(uint)local_150->g_FastPos[uVar42 >> (sbyte)iVar35] +
                                      iVar35 * 2];
                            p = local_150;
                          }
                          if (uVar27 < pCVar28->opt[uVar23].price) {
                            pCVar39 = pCVar28->opt + uVar23;
                            pCVar39->price = uVar27;
                            pCVar39->len = uVar23;
                            pCVar39->dist = uVar42 + 4;
                            pCVar39->extra = 0;
                          }
                          uVar42 = (int)uVar47 + 2;
                          if ((uVar23 == p->matches[uVar47]) && (uVar42 == local_18c)) break;
                          if (uVar23 == p->matches[uVar47]) {
                            uVar47 = (ulong)uVar42;
                          }
                          uVar23 = uVar23 + 1;
                        }
                      }
                      uVar33 = 1;
                      uVar45 = 1;
                      if (uVar14 != 1) {
                        uVar41 = 0;
                        uVar44 = 0x7fe;
                        uVar47 = 1;
                        local_f8 = uVar48;
LAB_0019b131:
                        uVar14 = (uint)uVar41;
                        local_118 = local_f8;
                        uVar42 = (uint)uVar40;
                        local_170 = CONCAT44(local_170._4_4_,uVar42);
                        local_120 = uVar44;
                        if (uVar14 < 0x7bf) {
                          local_140 = uVar47;
                          local_e8 = ReadMatchDistances(p,&local_18c);
                          if (local_e8 < p->numFastBytes) {
                            pCVar39 = pCVar28->opt + local_140;
                            UVar11 = pCVar28->opt[local_140].len;
                            uVar42 = (int)local_140 - UVar11;
                            if (UVar11 == 1) {
                              if (pCVar39->dist == 0) {
                                pBVar17 = "\t\t\t\t\t\t\t\v\v\v\v\v";
                              }
                              else {
                                pBVar17 = "";
                              }
                              uVar42 = (uint)pBVar17[pCVar28->opt[uVar42].state];
                              uVar33 = local_e0;
                            }
                            else {
                              uVar23 = pCVar39->dist;
                              uVar48 = (ulong)uVar23;
                              uVar6 = pCVar39->extra;
                              if (uVar6 == 0) {
                                uVar40 = (ulong)uVar42;
                                pUVar25 = pCVar28->opt[uVar40].reps;
                                uVar6 = pCVar28->opt[uVar40].state;
                                local_188[1] = *pUVar25;
                                if (uVar23 < 4) {
                                  uVar42 = (uint)"\b\b\b\b\b\b\b\v\v\v\v\v"[uVar6];
                                  goto LAB_0019b259;
                                }
                                uVar42 = (uint)"\a\a\a\a\a\a\a\n\n\n\n\n"[uVar6];
                              }
                              else {
                                uVar40 = (ulong)(uVar42 - uVar6);
                                uVar42 = (uVar23 < 4) + 7;
                                if (uVar6 != 1) {
                                  uVar42 = 8;
                                }
                                pUVar25 = pCVar28->opt[uVar40].reps;
                                local_188[1] = *pUVar25;
                                if (uVar23 < 4) {
LAB_0019b259:
                                  uVar33 = (ulong)local_188[1];
                                  if (uVar48 == 0) {
                                    local_12c = pUVar25[1];
                                    local_128 = pUVar25[2];
                                    local_130 = pUVar25[3];
                                    local_188[0] = local_188[1];
                                    local_188[1] = local_12c;
                                    local_188[2] = local_128;
                                    local_17c = local_130;
                                  }
                                  else {
                                    local_188[2] = pUVar25[1];
                                    local_12c = local_188[1];
                                    if (uVar23 == 1) {
                                      local_130 = pUVar25[3];
                                      uVar33 = (ulong)local_188[2];
                                      local_128 = pUVar25[2];
                                      local_188[0] = local_188[2];
                                      local_188[2] = pUVar25[2];
                                      local_17c = local_130;
                                    }
                                    else {
                                      local_188[0] = pCVar28->opt[uVar40].reps[uVar48];
                                      local_130 = pCVar28->opt[uVar40].reps[uVar48 ^ 1];
                                      uVar33 = (ulong)local_188[0];
                                      local_128 = local_188[2];
                                      local_17c = local_130;
                                    }
                                  }
                                  goto LAB_0019b2fe;
                                }
                              }
                              local_130 = pUVar25[2];
                              uVar33 = (ulong)(uVar23 - 3);
                              local_128 = pUVar25[1];
                              local_12c = local_188[1];
                              local_188[0] = uVar23 - 3;
                              local_188[2] = pUVar25[1];
                              local_17c = local_130;
                            }
LAB_0019b2fe:
                            uVar43 = (int)local_118 + 1;
                            uVar48 = (ulong)uVar43;
                            pCVar39->state = (CState)uVar42;
                            pCVar39->reps[0] = (UInt32)uVar33;
                            pCVar39->reps[1] = local_12c;
                            pCVar39->reps[2] = local_128;
                            pCVar39->reps[3] = local_130;
                            pBVar18 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                            pBVar17 = pBVar18 + -1;
                            bVar5 = pBVar18[-1];
                            local_c0 = uVar33 & 0xffffffff;
                            bVar4 = pBVar17[-local_c0];
                            local_160 = p->pbMask;
                            local_158 = (ulong)(local_160 & uVar43);
                            local_138 = (ulong)uVar42;
                            local_100 = local_138 * 0x20;
                            uVar27 = local_108[local_138][local_158] >> 2 & 0xfffffffc;
                            local_124 = *(int *)((long)p->ProbPrices + (ulong)(uVar27 ^ 0x1fc)) +
                                        pCVar39->price;
                            local_60 = local_140 + 1;
                            pCVar3 = pCVar28->opt + local_140 + 1;
                            uVar23 = pCVar28->opt[local_140 + 1].price;
                            bVar49 = false;
                            local_f8 = uVar48;
                            local_e0 = uVar33;
                            if (uVar23 < 0x40000000 && bVar4 == bVar5) {
                              uVar27 = 0;
                              uVar40 = local_170 & 0xffffffff;
                            }
                            else {
                              uVar27 = pCVar39->price +
                                       *(int *)((long)p->ProbPrices + (ulong)uVar27);
                              uVar40 = local_170 & 0xffffffff;
                              if (uVar23 < uVar27) {
                                uVar27 = 0;
                              }
                              else {
                                if (uVar42 < 7) {
                                  UVar11 = 0;
                                  uVar42 = bVar5 | 0x100;
                                  do {
                                    UVar11 = UVar11 + local_168[(-(uVar42 & 1) & 0x7f0 ^
                                                                (uint)*(ushort *)
                                                                       ((long)(p->litProbs +
                                                                              ((((uint)pBVar18[-2] |
                                                                                uVar43 * 0x100) &
                                                                               p->lpMask) <<
                                                                              ((byte)p->lc & 0x1f))
                                                                              * 3) +
                                                                       (ulong)(uVar42 & 0xfffffffe))
                                                                ) >> 4];
                                    bVar49 = 3 < uVar42;
                                    uVar42 = uVar42 >> 1;
                                  } while (bVar49);
                                }
                                else {
                                  UVar11 = LitEnc_Matched_GetPrice
                                                     (p->litProbs +
                                                      ((((uint)pBVar18[-2] | uVar43 * 0x100) &
                                                       p->lpMask) << ((byte)p->lc & 0x1f)) * 3,
                                                      (uint)bVar5,(uint)bVar4,local_168);
                                  uVar40 = local_170 & 0xffffffff;
                                }
                                uVar27 = UVar11 + uVar27;
                                bVar49 = uVar27 < uVar23;
                                if (bVar49) {
                                  pCVar3->price = uVar27;
                                  pCVar3->len = 1;
                                  pCVar3->dist = 0xffffffff;
                                  pCVar3->extra = 0;
                                  uVar23 = uVar27;
                                }
                              }
                            }
                            local_15c = *(int *)((long)p->ProbPrices +
                                                (ulong)(p->isRep[local_138] >> 2 & 0xfffffffc ^
                                                       0x1fc)) + local_124;
                            uVar42 = p->numAvail;
                            local_c8 = (ulong)uVar42;
                            uVar43 = 0x7fe - uVar14;
                            if (uVar42 < 0x7fe - uVar14) {
                              uVar43 = uVar42;
                            }
                            if ((((((uint)local_138 < 7) && (bVar4 == bVar5)) &&
                                 (local_15c < uVar23)) && ((pCVar3->len < 2 || (pCVar3->dist != 0)))
                                ) && (uVar42 = p->ProbPrices[p->isRepG0[local_138] >> 4] + local_15c
                                               + p->ProbPrices
                                                 [*(ushort *)
                                                   ((long)*local_110 + local_158 * 2 + local_100) >>
                                                  4], uVar42 < uVar23)) {
                              pCVar3->price = uVar42;
                              pCVar3->len = 1;
                              pCVar3->dist = 0;
                              pCVar3->extra = 0;
                              bVar49 = false;
                            }
                            iVar29 = (int)local_120;
                            uVar48 = local_120 & 0xffffffff;
                            uVar41 = local_140;
                            if (1 < uVar43) {
                              uVar42 = p->numFastBytes;
                              uVar14 = uVar42;
                              if (uVar43 < uVar42) {
                                uVar14 = uVar43;
                              }
                              if (((uVar27 != 0 && !bVar49) && (bVar4 != bVar5)) &&
                                 ((uVar43 != 2 &&
                                  ((lVar24 = -local_c0, *pBVar18 == pBVar18[lVar24] &&
                                   (pBVar18[1] == pBVar18[lVar24 + 1])))))) {
                                uVar13 = uVar42 + 1;
                                uVar23 = uVar43;
                                if (uVar13 < uVar43) {
                                  uVar23 = uVar13;
                                }
                                uVar33 = 3;
                                if (3 < uVar23) {
                                  uVar40 = uVar48;
                                  if (local_c8 < uVar48) {
                                    uVar40 = local_c8;
                                  }
                                  if (uVar13 <= uVar40) {
                                    uVar40 = (ulong)uVar13;
                                  }
                                  uVar33 = 3;
                                  do {
                                    if (pBVar18[uVar33 - 1] != pBVar18[uVar33 + lVar24 + -1])
                                    goto LAB_0019b6f9;
                                    uVar33 = uVar33 + 1;
                                  } while (uVar40 != uVar33);
                                  uVar33 = (ulong)uVar23;
                                }
LAB_0019b6f9:
                                bVar5 = ""[local_138];
                                uVar45 = (ulong)((int)local_118 + 2U & local_160);
                                uVar23 = (int)uVar33 + (int)local_140;
                                if ((uint)local_170 <= uVar23) {
                                  local_170._0_4_ = uVar23;
                                }
                                uVar40 = (ulong)(uint)local_170;
                                uVar13 = (int)uVar33 - 1;
                                uVar27 = uVar27 + *(int *)((long)p->ProbPrices +
                                                          (ulong)(local_108[bVar5][uVar45] >> 2 &
                                                                  0xfffffffc ^ 0x1fc)) +
                                         *(int *)((long)p->ProbPrices +
                                                 (ulong)(local_110[bVar5][uVar45] >> 2 & 0xfffffffc
                                                        ^ 0x1fc)) +
                                         *(int *)((long)p->ProbPrices +
                                                 (ulong)(p->isRep[bVar5] >> 2 & 0xfffffffc ^ 0x1fc))
                                         + p->ProbPrices[p->isRepG0[bVar5] >> 4] +
                                         local_f0[uVar45 - 1][(ulong)uVar13 + 0x10e];
                                if (uVar27 < pCVar28->opt[uVar23].price) {
                                  pCVar39 = pCVar28->opt + uVar23;
                                  pCVar39->price = uVar27;
                                  pCVar39->len = uVar13;
                                  pCVar39->dist = 0;
                                  pCVar39->extra = 1;
                                }
                              }
                              local_68 = (ushort *)((long)*local_110 + local_158 * 2 + local_100);
                              local_170 = local_c8;
                              if (uVar42 <= local_c8) {
                                local_170 = (ulong)uVar42;
                              }
                              if (uVar48 <= local_170) {
                                local_170 = uVar48;
                              }
                              uVar45 = 2;
                              lVar24 = 0;
                              uVar33 = local_158;
                              pBVar37 = pBVar18;
                              local_148 = pBVar18;
                              local_120 = uVar48;
                              do {
                                pBVar19 = pBVar17 + -(ulong)local_188[lVar24];
                                if ((*pBVar17 == *pBVar19) && (*pBVar37 == pBVar19[1])) {
                                  lVar34 = -(ulong)local_188[lVar24];
                                  uVar48 = 2;
                                  if (2 < uVar14) {
                                    uVar47 = 2;
                                    do {
                                      uVar48 = uVar47;
                                      if (pBVar37[uVar47 - 1] != pBVar37[uVar47 + lVar34 + -1])
                                      break;
                                      uVar47 = uVar47 + 1;
                                      uVar48 = (ulong)uVar14;
                                    } while (local_170 != uVar47);
                                  }
                                  uVar23 = (uint)uVar48;
                                  uVar27 = uVar23 + (int)uVar41;
                                  if (uVar27 < (uint)uVar40) {
                                    uVar27 = (uint)uVar40;
                                  }
                                  uVar13 = (uint)(p->isRepG0[local_138] >> 4);
                                  UVar11 = (UInt32)lVar24;
                                  if (lVar24 == 0) {
                                    iVar29 = *(int *)((long)local_168 +
                                                     (ulong)(*local_68 >> 2 & 0xfffffffc ^ 0x1fc)) +
                                             local_168[uVar13];
                                  }
                                  else {
                                    uVar15 = (uint)(p->isRepG1[local_138] >> 4);
                                    if (lVar24 == 1) {
                                      iVar29 = p->ProbPrices[uVar13 ^ 0x7f] + local_168[uVar15];
                                    }
                                    else {
                                      iVar29 = p->ProbPrices[uVar13 ^ 0x7f] +
                                               p->ProbPrices[uVar15 ^ 0x7f] +
                                               p->ProbPrices
                                               [(2 - UVar11 & 0x7f0 ^ (uint)p->isRepG2[local_138])
                                                >> 4];
                                    }
                                  }
                                  iVar29 = iVar29 + local_15c;
                                  uVar40 = uVar48 & 0xffffffff;
                                  do {
                                    UVar12 = (UInt32)uVar40;
                                    uVar13 = local_f0[uVar33 - 1][uVar40 + 0x10e] + iVar29;
                                    uVar15 = (int)uVar41 + UVar12;
                                    if (uVar13 < pCVar28->opt[uVar15].price) {
                                      pCVar39 = pCVar28->opt + uVar15;
                                      pCVar39->price = uVar13;
                                      pCVar39->len = UVar12;
                                      pCVar39->dist = UVar11;
                                      pCVar39->extra = 0;
                                    }
                                    uVar40 = (ulong)(UVar12 - 1);
                                  } while (1 < UVar12 - 1);
                                  uVar48 = uVar48 & 0xffffffff;
                                  uVar40 = uVar48 + 1;
                                  if (lVar24 == 0) {
                                    uVar45 = uVar40 & 0xffffffff;
                                  }
                                  uVar15 = uVar42 + (int)uVar40;
                                  local_118 = CONCAT44(local_118._4_4_,uVar15);
                                  uVar13 = uVar43;
                                  if (uVar15 < uVar43) {
                                    uVar13 = uVar15;
                                  }
                                  uVar15 = uVar23 + 3;
                                  uVar47 = (ulong)uVar15;
                                  if (uVar15 <= uVar13) {
                                    local_100 = CONCAT44(local_100._4_4_,uVar13);
                                    local_c0 = uVar40;
                                    if ((pBVar17[uVar40] != pBVar19[uVar40]) ||
                                       (pBVar18[uVar48 + 1] != pBVar19[uVar48 + 2])) {
                                      uVar40 = (ulong)uVar27;
                                      pBVar37 = local_148;
                                      goto LAB_0019bb3c;
                                    }
                                    uVar13 = (int)local_f8 + uVar23;
                                    local_78 = (ulong)(uVar13 & local_160);
                                    local_a8 = local_f0[uVar33 - 1][uVar48 + 0x10e];
                                    local_ac = p->ProbPrices
                                               [local_108["\b\b\b\b\b\b\b\v\v\v\v\v"[local_138]]
                                                [local_78] >> 4];
                                    local_b0 = LitEnc_Matched_GetPrice
                                                         (p->litProbs +
                                                          ((((uint)pBVar18[uVar48 - 2] |
                                                            uVar13 * 0x100) & p->lpMask) <<
                                                          ((byte)p->lc & 0x1f)) * 3,
                                                          (uint)pBVar17[uVar48],
                                                          (uint)pBVar19[uVar48],local_168);
                                    if (uVar15 < (uint)local_100) {
                                      uVar13 = (uint)local_120;
                                      if ((uint)local_c8 < (uint)local_120) {
                                        uVar13 = (uint)local_c8;
                                      }
                                      if ((uint)local_118 <= uVar13) {
                                        uVar13 = (uint)local_118;
                                      }
                                      pBVar37 = pBVar17 + uVar47;
                                      do {
                                        uVar15 = (uint)uVar47;
                                        if (*pBVar37 != pBVar37[lVar34]) break;
                                        uVar30 = (uint)uVar47 + 1;
                                        uVar47 = (ulong)uVar30;
                                        pBVar37 = pBVar37 + 1;
                                        uVar15 = (uint)local_100;
                                      } while (uVar13 != uVar30);
                                    }
                                    uVar48 = (ulong)((int)local_78 + 1U & local_160);
                                    uVar13 = (int)local_140 + uVar15;
                                    if (uVar27 <= uVar13) {
                                      uVar27 = uVar13;
                                    }
                                    uVar30 = local_a8 + iVar29 + local_ac + local_b0 +
                                             *(int *)((long)p->ProbPrices +
                                                     (ulong)(p->isMatch[5][uVar48] >> 2 & 0xfffffffc
                                                            ^ 0x1fc)) +
                                             *(int *)((long)p->ProbPrices +
                                                     (ulong)(p->isRep0Long[5][uVar48] >> 2 &
                                                             0xfffffffc ^ 0x1fc)) +
                                             *(int *)((long)p->ProbPrices +
                                                     (ulong)(p->isRep[5] >> 2 & 0xfffffffc ^ 0x1fc))
                                             + p->ProbPrices[p->isRepG0[5] >> 4] +
                                             local_f0[uVar48 - 1][(ulong)(~uVar23 + uVar15) + 0x10e]
                                    ;
                                    uVar33 = local_158;
                                    pBVar37 = local_148;
                                    uVar41 = local_140;
                                    if (uVar30 < pCVar28->opt[uVar13].price) {
                                      pCVar39 = pCVar28->opt + uVar13;
                                      pCVar39->price = uVar30;
                                      pCVar39->len = ~uVar23 + uVar15;
                                      pCVar39->extra = (CExtra)local_c0;
                                      pCVar39->dist = UVar11;
                                    }
                                  }
                                  uVar40 = (ulong)uVar27;
                                }
LAB_0019bb3c:
                                lVar24 = lVar24 + 1;
                              } while (lVar24 != 4);
                              uVar23 = local_e8;
                              if (uVar14 < local_e8) {
                                local_18c = 0;
                                do {
                                  uVar23 = local_18c;
                                  local_18c = uVar23 + 2;
                                } while (p->matches[uVar23] < uVar14);
                                p->matches[uVar23] = uVar14;
                                uVar23 = uVar14;
                              }
                              uVar14 = (uint)uVar45;
                              if (uVar14 <= uVar23) {
                                uVar48 = 0xfffffffe;
                                do {
                                  uVar48 = (ulong)((int)uVar48 + 2);
                                } while (p->matches[uVar48] < uVar14);
                                uVar23 = uVar23 + (int)uVar41;
                                iVar29 = p->ProbPrices[p->isRep[local_138] >> 4] + local_124;
                                uVar27 = (uint)uVar40;
                                if ((uint)uVar40 <= uVar23) {
                                  uVar27 = uVar23;
                                }
                                local_170 = CONCAT44(local_170._4_4_,uVar27);
                                uVar40 = (ulong)p->matches[uVar48 + 1];
                                iVar22 = 0x13;
                                if (uVar40 < 0x100000) {
                                  iVar22 = 6;
                                }
                                uVar47 = (ulong)((uint)p->g_FastPos
                                                       [p->matches[uVar48 + 1] >> (sbyte)iVar22] +
                                                iVar22 * 2);
                                pBVar37 = pBVar37 + -2;
                                local_15c = local_18c;
                                uVar14 = uVar14 + 3;
                                local_148 = pBVar37;
                                do {
                                  uVar23 = (uint)uVar45;
                                  uVar44 = (ulong)(uVar23 - 2);
                                  if (2 < uVar23 - 2) {
                                    uVar44 = 3;
                                  }
                                  uVar27 = (uint)uVar40;
                                  if (uVar27 < 0x80) {
                                    UVar11 = local_90[uVar44][uVar40];
                                  }
                                  else {
                                    UVar11 = p->alignPrices[uVar27 & 0xf] + local_88[uVar44][uVar47]
                                    ;
                                  }
                                  uVar15 = local_80[uVar33 - 1][uVar45 + 0x10e] + iVar29 + UVar11;
                                  uVar13 = (int)uVar41 + uVar23;
                                  if (uVar15 < pCVar28->opt[uVar13].price) {
                                    pCVar39 = pCVar28->opt + uVar13;
                                    pCVar39->price = uVar15;
                                    pCVar39->len = uVar23;
                                    pCVar39->dist = uVar27 + 4;
                                    pCVar39->extra = 0;
                                  }
                                  if (uVar23 == p->matches[uVar48]) {
                                    uVar30 = uVar23 + 1;
                                    uVar13 = uVar42 + uVar23 + 1;
                                    if (uVar43 <= uVar13) {
                                      uVar13 = uVar43;
                                    }
                                    uVar31 = uVar23 + 3;
                                    uVar47 = (ulong)uVar31;
                                    if (((uVar31 <= uVar13) &&
                                        (uVar33 = local_158,
                                        pBVar17[uVar30] == pBVar37[uVar30 - uVar40])) &&
                                       (pBVar17[uVar23 + 2] == pBVar37[(uVar23 + 2) - uVar40])) {
                                      if (uVar31 < uVar13) {
                                        uVar47 = (ulong)uVar14;
                                        do {
                                          if (pBVar17[uVar47] != pBVar37[uVar47 - uVar40]) break;
                                          uVar47 = uVar47 + 1;
                                        } while (uVar47 < uVar13);
                                      }
                                      uVar13 = (int)local_f8 + uVar23;
                                      local_118 = (ulong)(uVar13 & local_160);
                                      CVar36 = p->ProbPrices
                                               [local_108["\a\a\a\a\a\a\a\n\n\n\n\n"[local_138]]
                                                [local_118] >> 4];
                                      UVar11 = LitEnc_Matched_GetPrice
                                                         (p->litProbs +
                                                          ((((uint)pBVar18[uVar45 - 2] |
                                                            uVar13 * 0x100) & p->lpMask) <<
                                                          ((byte)p->lc & 0x1f)) * 3,
                                                          (uint)pBVar17[uVar45],
                                                          (uint)pBVar37[uVar45 - uVar40],local_168);
                                      uVar40 = (ulong)((int)local_118 + 1U & local_160);
                                      uVar31 = (int)local_140 + (int)uVar47;
                                      uVar13 = (uint)local_170;
                                      if ((uint)local_170 <= uVar31) {
                                        uVar13 = uVar31;
                                      }
                                      local_170 = CONCAT44(local_170._4_4_,uVar13);
                                      uVar32 = ~uVar23 + (int)uVar47;
                                      uVar13 = UVar11 + uVar15 + CVar36 +
                                               *(int *)((long)p->ProbPrices +
                                                       (ulong)(p->isMatch[4][uVar40] >> 2 &
                                                               0xfffffffc ^ 0x1fc)) +
                                               *(int *)((long)p->ProbPrices +
                                                       (ulong)(p->isRep0Long[4][uVar40] >> 2 &
                                                               0xfffffffc ^ 0x1fc)) +
                                               *(int *)((long)p->ProbPrices +
                                                       (ulong)(p->isRep[4] >> 2 & 0xfffffffc ^ 0x1fc
                                                              )) + p->ProbPrices[p->isRepG0[4] >> 4]
                                               + local_f0[uVar40 - 1][(ulong)uVar32 + 0x10e];
                                      uVar33 = local_158;
                                      pBVar37 = local_148;
                                      uVar41 = local_140;
                                      if (uVar13 < pCVar28->opt[uVar31].price) {
                                        pCVar39 = pCVar28->opt + uVar31;
                                        pCVar39->price = uVar13;
                                        pCVar39->len = uVar32;
                                        pCVar39->extra = (CExtra)uVar30;
                                        pCVar39->dist = uVar27 + 4;
                                      }
                                    }
                                    uVar27 = (int)uVar48 + 2;
                                    uVar48 = (ulong)uVar27;
                                    if (uVar27 == local_15c) goto LAB_0019c042;
                                    uVar40 = (ulong)p->matches[(ulong)uVar27 + 1];
                                    iVar22 = 0x13;
                                    if (uVar40 < 0x100000) {
                                      iVar22 = 6;
                                    }
                                    uVar47 = (ulong)((uint)p->g_FastPos
                                                           [p->matches[(ulong)uVar27 + 1] >>
                                                            (sbyte)iVar22] + iVar22 * 2);
                                  }
                                  uVar14 = uVar14 + 1;
                                  uVar45 = (ulong)(uVar23 + 1);
                                } while( true );
                              }
                              iVar29 = (int)local_120;
                            }
                            goto LAB_0019c054;
                          }
                          p->numPairs = local_18c;
                          p->longestMatchLen = local_e8;
                          uVar33 = local_170 & 0xffffffff;
                          uVar45 = local_140;
                        }
                        else {
                          uVar14 = uVar14 + 2;
                          if (uVar14 <= uVar42) {
                            uVar23 = pCVar28->opt[uVar47 & 0xffffffff].price;
                            uVar45 = uVar47 & 0xffffffff;
                            do {
                              uVar27 = pCVar28->opt[uVar14].price;
                              if (uVar27 <= uVar23) {
                                uVar45 = (ulong)uVar14;
                                uVar23 = uVar27;
                              }
                              uVar14 = uVar14 + 1;
                            } while (uVar14 <= uVar42);
                            UVar11 = (int)uVar45 - (int)uVar47;
                            if (UVar11 != 0) {
                              p->additionalOffset = p->additionalOffset + UVar11;
                              (*(p->matchFinder).Skip)(p->matchFinderObj,UVar11);
                              uVar33 = local_170 & 0xffffffff;
                              goto LAB_0019cbde;
                            }
                          }
                          uVar33 = uVar40;
                          uVar45 = uVar47 & 0xffffffff;
                        }
                      }
LAB_0019cbde:
                      do {
                        pCVar28->opt[uVar33].price = 0x40000000;
                        uVar42 = (int)uVar33 - 1;
                        uVar33 = (ulong)uVar42;
                      } while (uVar42 != 0);
                      uVar42 = (int)uVar45 + 1;
                      p->optEnd = uVar42;
                      while( true ) {
                        uVar48 = uVar45 & 0xffffffff;
                        uVar14 = pCVar28->opt[uVar48].len;
                        UVar11 = pCVar28->opt[uVar48].dist;
                        uVar6 = pCVar28->opt[uVar48].extra;
                        uVar23 = (int)uVar45 - uVar14;
                        uVar45 = (ulong)uVar23;
                        if (uVar6 != 0) {
                          uVar27 = uVar42 - 1;
                          pCVar28->opt[uVar27].len = uVar14;
                          uVar14 = (uint)uVar6;
                          uVar45 = (ulong)(uVar23 - uVar14);
                          if (uVar14 == 1) {
                            pCVar28->opt[uVar27].dist = UVar11;
                            uVar14 = 1;
                            UVar11 = 0xffffffff;
                            uVar42 = uVar27;
                          }
                          else {
                            pCVar28->opt[uVar27].dist = 0;
                            uVar14 = uVar14 - 1;
                            uVar42 = uVar42 - 2;
                            pCVar28->opt[uVar42].len = 1;
                            pCVar28->opt[uVar42].dist = 0xffffffff;
                          }
                        }
                        if ((int)uVar45 == 0) break;
                        uVar42 = uVar42 - 1;
                        pCVar28->opt[uVar42].dist = UVar11;
                        pCVar28->opt[uVar42].len = uVar14;
                      }
                      p->backRes = UVar11;
                      p->optCur = uVar42;
                    }
                    else {
                      p->backRes = p->matches[(ulong)local_18c - 1] + 4;
                      p->additionalOffset = p->additionalOffset + (uVar42 - 1);
                      (*(p->matchFinder).Skip)(p->matchFinderObj,uVar42 - 1);
                      uVar14 = uVar42;
                    }
                  }
                  else {
                    p->backRes = uVar27;
                    p->additionalOffset = p->additionalOffset + (uVar14 - 1);
                    (*(p->matchFinder).Skip)(p->matchFinderObj,uVar14 - 1);
                  }
                }
              }
              else {
                uVar14 = pCVar28->opt[uVar42].len;
                p->backRes = pCVar28->opt[uVar42].dist;
                p->optCur = uVar42 + 1;
              }
            }
            else {
              if (p->additionalOffset == 0) {
                uVar42 = ReadMatchDistances(p,local_188);
              }
              else {
                uVar42 = p->longestMatchLen;
                local_188[0] = p->numPairs;
              }
              uVar23 = p->numAvail;
              p->backRes = 0xffffffff;
              uVar14 = 1;
              if (1 < uVar23) {
                uVar27 = 0x111;
                if (uVar23 < 0x111) {
                  uVar27 = uVar23;
                }
                pBVar17 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                if (uVar27 < 4) {
                  uVar27 = 3;
                }
                lVar24 = 0;
                UVar11 = 0;
                uVar48 = 0;
                do {
                  if ((pBVar17[-1] == pBVar17[~(ulong)p->reps[lVar24]]) &&
                     (lVar34 = -(ulong)p->reps[lVar24], *pBVar17 == pBVar17[lVar34])) {
                    uVar40 = 2;
                    if (uVar23 != 2) {
                      uVar33 = 2;
                      do {
                        uVar40 = uVar33;
                        if (pBVar17[uVar33 - 1] != pBVar17[uVar33 + lVar34 + -1]) break;
                        uVar33 = uVar33 + 1;
                        uVar40 = (ulong)uVar27;
                      } while (uVar27 != uVar33);
                    }
                    uVar14 = (uint)uVar40;
                    if (p->numFastBytes <= uVar14) {
                      p->backRes = (UInt32)lVar24;
                      UVar11 = uVar14 - 1;
                      goto LAB_0019ad7b;
                    }
                    if ((uint)uVar48 < uVar14) {
                      uVar48 = uVar40 & 0xffffffff;
                      UVar11 = (UInt32)lVar24;
                    }
                  }
                  uVar14 = (uint)uVar48;
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 4);
                if (uVar42 < p->numFastBytes) {
                  uVar27 = 0;
                  if (1 < uVar42) {
                    uVar48 = (ulong)local_188[0];
                    uVar27 = p->matches[uVar48 - 1];
                    if (2 < uVar48) {
                      do {
                        if ((uVar42 != p->matches[uVar48 - 4] + 1) ||
                           (uVar43 = p->matches[uVar48 - 3], uVar27 >> 7 <= uVar43)) break;
                        uVar13 = (int)uVar48 - 2;
                        uVar48 = (ulong)uVar13;
                        uVar42 = uVar42 - 1;
                        uVar27 = uVar43;
                      } while (2 < uVar13);
                    }
                    uVar43 = uVar42;
                    if (0x7f < uVar27) {
                      uVar43 = 1;
                    }
                    if (uVar42 == 2) {
                      uVar42 = uVar43;
                    }
                  }
                  if ((uVar14 < 2) ||
                     (((uVar14 + 1 < uVar42 && ((uVar14 + 2 < uVar42 || (uVar27 < 0x200)))) &&
                      ((uVar14 + 3 < uVar42 || (uVar27 < 0x8000)))))) {
                    if ((uVar23 != 2) && (1 < uVar42)) {
                      uVar14 = ReadMatchDistances(p,local_70);
                      p->longestMatchLen = uVar14;
                      if (uVar14 < 2) {
LAB_0019ae10:
                        pBVar17 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                        lVar24 = 0;
                        do {
                          if ((pBVar17[-1] == pBVar17[~(ulong)p->reps[lVar24]]) &&
                             (lVar34 = -(ulong)p->reps[lVar24], *pBVar17 == pBVar17[lVar34])) {
                            if (uVar42 - 1 < 3) goto LAB_0019c094;
                            lVar38 = 0;
                            while (pBVar17[lVar38 + 1] == pBVar17[lVar38 + lVar34 + 1]) {
                              lVar38 = lVar38 + 1;
                              if ((ulong)(uVar42 - 1) - 2 == lVar38) goto LAB_0019c094;
                            }
                          }
                          lVar24 = lVar24 + 1;
                        } while (lVar24 != 4);
                        p->backRes = uVar27 + 4;
                        uVar14 = 2;
                        if (uVar42 == 2) goto LAB_0019c099;
                        UVar11 = uVar42 - 2;
                        uVar14 = uVar42;
                        goto LAB_0019ad7b;
                      }
                      uVar23 = p->matches[(ulong)p->numPairs - 1];
                      if ((uVar14 < uVar42) || (uVar27 <= uVar23)) {
                        if (((uVar14 <= uVar42 + 1) &&
                            (uVar14 != uVar42 + 1 || uVar27 < uVar23 >> 7)) &&
                           (((uVar42 < 3 || (uVar14 + 1 < uVar42)) || (uVar27 >> 7 <= uVar23))))
                        goto LAB_0019ae10;
                      }
                    }
LAB_0019c094:
                    uVar14 = 1;
                    goto LAB_0019c099;
                  }
                  p->backRes = UVar11;
                  UVar11 = uVar14 - 1;
                }
                else {
                  p->backRes = p->matches[(ulong)local_188[0] - 1] + 4;
                  UVar11 = uVar42 - 1;
                  uVar14 = uVar42;
                }
LAB_0019ad7b:
                p->additionalOffset = p->additionalOffset + UVar11;
                (*(p->matchFinder).Skip)(p->matchFinderObj,UVar11);
              }
            }
LAB_0019c099:
            uVar43 = p->pbMask & uVar26;
            uVar48 = (ulong)p->state;
            uVar42 = (p->rc).range;
            pCVar46 = local_108[uVar48] + uVar43;
            uVar6 = *pCVar46;
            uVar27 = (uVar42 >> 0xb) * (uint)uVar6;
            uVar23 = p->backRes;
            if (uVar23 == 0xffffffff) {
              *pCVar46 = (short)(0x800 - uVar6 >> 5) + uVar6;
              if (uVar27 < 0x1000000) {
                uVar27 = uVar27 * 0x100;
                RangeEnc_ShiftLow(p_00);
              }
              p = local_150;
              (local_150->rc).range = uVar27;
              pBVar17 = (*(local_150->matchFinder).GetPointerToCurrentPos)
                                  (local_150->matchFinderObj);
              uVar42 = p->state;
              pbVar20 = pBVar17 + -(ulong)p->additionalOffset;
              pCVar46 = p->litProbs +
                        ((((uint)pbVar20[-1] | uVar26 << 8) & p->lpMask) << ((byte)p->lc & 0x1f)) *
                        3;
              bVar5 = *pbVar20;
              p->state = (uint)""[uVar42];
              if ((ulong)uVar42 < 7) {
                LitEnc_Encode(p_00,pCVar46,(uint)bVar5);
              }
              else {
                UVar11 = (p->rc).range;
                uVar42 = (uint)pbVar20[-(ulong)p->reps[0]];
                uVar27 = 0x100;
                uVar23 = bVar5 | 0x100;
                do {
                  uVar42 = uVar42 * 2;
                  uVar43 = (uVar23 >> 8) + uVar27 + (uVar42 & uVar27);
                  uVar13 = uVar23 >> 7 & 1;
                  uVar6 = pCVar46[uVar43];
                  uVar15 = (UVar11 >> 0xb) * (uint)uVar6;
                  uVar30 = -uVar13;
                  uVar31 = uVar30 & uVar15;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar31;
                  uVar13 = uVar13 - 1;
                  UVar11 = (uVar15 & uVar13) + ((UVar11 & uVar30) - uVar31);
                  pCVar46[uVar43] = (short)(((uVar13 & 0x7e1) - (uint)uVar6) + 0x1f >> 5) + uVar6;
                  if (UVar11 < 0x1000000) {
                    UVar11 = UVar11 * 0x100;
                    RangeEnc_ShiftLow(p_00);
                  }
                  uVar27 = uVar27 & ~(uVar42 ^ uVar23 * 2);
                  bVar49 = uVar23 < 0x8000;
                  uVar23 = uVar23 * 2;
                } while (bVar49);
                p_00->range = UVar11;
              }
            }
            else {
              uVar42 = uVar42 - uVar27;
              pUVar1 = &(p->rc).low;
              *pUVar1 = *pUVar1 + (ulong)uVar27;
              *pCVar46 = uVar6 - (uVar6 >> 5);
              if (uVar42 < 0x1000000) {
                uVar42 = uVar42 * 0x100;
                RangeEnc_ShiftLow(p_00);
                uVar48 = (ulong)p->state;
              }
              uVar6 = p->isRep[uVar48];
              uVar27 = (uVar42 >> 0xb) * (uint)uVar6;
              if (uVar23 < 4) {
                uVar42 = uVar42 - uVar27;
                pUVar1 = &(p->rc).low;
                *pUVar1 = *pUVar1 + (ulong)uVar27;
                p->isRep[uVar48] = uVar6 - (uVar6 >> 5);
                if (uVar42 < 0x1000000) {
                  uVar42 = uVar42 * 0x100;
                  RangeEnc_ShiftLow(p_00);
                  uVar48 = (ulong)p->state;
                }
                uVar6 = p->isRepG0[uVar48];
                uVar27 = (uVar42 >> 0xb) * (uint)uVar6;
                if (uVar23 == 0) {
                  p->isRepG0[uVar48] = (short)(0x800 - uVar6 >> 5) + uVar6;
                  if (uVar27 < 0x1000000) {
                    uVar27 = uVar27 * 0x100;
                    RangeEnc_ShiftLow(p_00);
                    uVar48 = (ulong)p->state;
                  }
                  pCVar46 = local_110[uVar48] + uVar43;
                  uVar6 = *pCVar46;
                  uVar42 = (uVar27 >> 0xb) * (uint)uVar6;
                  if (uVar14 == 1) {
                    *pCVar46 = (short)(0x800 - uVar6 >> 5) + uVar6;
                    p->state = (uint)"\t\t\t\t\t\t\t\v\v\v\v\v"[uVar48];
                    uVar27 = uVar42;
                  }
                  else {
                    uVar27 = uVar27 - uVar42;
                    pUVar1 = &(p->rc).low;
                    *pUVar1 = *pUVar1 + (ulong)uVar42;
                    *pCVar46 = uVar6 - (uVar6 >> 5);
                  }
                }
                else {
                  uVar42 = uVar42 - uVar27;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar27;
                  p->isRepG0[uVar48] = uVar6 - (uVar6 >> 5);
                  if (uVar42 < 0x1000000) {
                    uVar42 = uVar42 * 0x100;
                    RangeEnc_ShiftLow(p_00);
                    uVar48 = (ulong)p->state;
                  }
                  uVar6 = p->isRepG1[uVar48];
                  uVar27 = (uVar42 >> 0xb) * (uint)uVar6;
                  if (uVar23 == 1) {
                    p->isRepG1[uVar48] = (short)(0x800 - uVar6 >> 5) + uVar6;
                    UVar11 = p->reps[1];
                  }
                  else {
                    uVar42 = uVar42 - uVar27;
                    pUVar1 = &(p->rc).low;
                    *pUVar1 = *pUVar1 + (ulong)uVar27;
                    p->isRepG1[uVar48] = uVar6 - (uVar6 >> 5);
                    if (uVar42 < 0x1000000) {
                      uVar42 = uVar42 * 0x100;
                      RangeEnc_ShiftLow(p_00);
                      uVar48 = (ulong)p->state;
                    }
                    uVar6 = p->isRepG2[uVar48];
                    uVar13 = (uVar42 >> 0xb) * (uint)uVar6;
                    if (uVar23 == 2) {
                      sVar7 = (short)(0x800 - uVar6 >> 5);
                      UVar11 = p->reps[2];
                      uVar27 = uVar13;
                    }
                    else {
                      uVar27 = uVar42 - uVar13;
                      pUVar1 = &(p->rc).low;
                      *pUVar1 = *pUVar1 + (ulong)uVar13;
                      sVar7 = -(uVar6 >> 5);
                      UVar11 = p->reps[3];
                      p->reps[3] = p->reps[2];
                    }
                    p->isRepG2[uVar48] = sVar7 + uVar6;
                    p->reps[2] = p->reps[1];
                  }
                  p->reps[1] = p->reps[0];
                  p->reps[0] = UVar11;
                }
                if (uVar27 < 0x1000000) {
                  uVar27 = uVar27 << 8;
                  RangeEnc_ShiftLow(p_00);
                }
                p_00->range = uVar27;
                if (uVar14 != 1) {
                  LenEnc_Encode(local_a0,p_00,uVar14 - 2,uVar43);
                  p->repLenEncCounter = p->repLenEncCounter + -1;
                  p->state = (uint)"\b\b\b\b\b\b\b\v\v\v\v\v"[p->state];
                }
              }
              else {
                p->isRep[uVar48] = (short)(0x800 - uVar6 >> 5) + uVar6;
                if (uVar27 < 0x1000000) {
                  uVar27 = uVar27 * 0x100;
                  RangeEnc_ShiftLow(p_00);
                  uVar48 = (ulong)p->state;
                }
                (p->rc).range = uVar27;
                p->state = (uint)"\a\a\a\a\a\a\a\n\n\n\n\n"[uVar48];
                LenEnc_Encode(local_98,p_00,uVar14 - 2,uVar43);
                paCVar10 = local_38;
                p->reps[3] = p->reps[2];
                *(undefined8 *)(p->reps + 1) = *(undefined8 *)p->reps;
                p->reps[0] = uVar23 - 3;
                p->matchPriceCount = p->matchPriceCount + 1;
                uVar42 = uVar23 - 4;
                if (uVar42 < 0x80) {
                  uVar27 = (uint)p->g_FastPos[uVar42];
                }
                else {
                  iVar29 = 0x13;
                  if (uVar42 < 0x100000) {
                    iVar29 = 6;
                  }
                  uVar27 = (uint)p->g_FastPos[uVar42 >> (sbyte)iVar29] + iVar29 * 2;
                }
                uVar43 = uVar27 + 0x40;
                uVar48 = (ulong)p_00->range;
                uVar13 = uVar14 - 2;
                if (4 < uVar14) {
                  uVar13 = 3;
                }
                do {
                  uVar40 = (ulong)(uVar43 >> 5 & 0x7fffffe);
                  uVar15 = uVar43 >> 5 & 1;
                  uVar6 = *(ushort *)((long)paCVar10[uVar13] + uVar40);
                  uVar30 = (int)(uVar48 >> 0xb) * (uint)uVar6;
                  uVar31 = -uVar15;
                  uVar32 = uVar31 & uVar30;
                  pUVar1 = &(p->rc).low;
                  *pUVar1 = *pUVar1 + (ulong)uVar32;
                  uVar15 = uVar15 - 1;
                  uVar30 = (uVar30 & uVar15) + (((uint)uVar48 & uVar31) - uVar32);
                  *(ushort *)((long)paCVar10[uVar13] + uVar40) =
                       (short)(((uVar15 & 0x7e1) - (uint)uVar6) + 0x1f >> 5) + uVar6;
                  if (uVar30 < 0x1000000) {
                    uVar30 = uVar30 * 0x100;
                    RangeEnc_ShiftLow(p_00);
                  }
                  pCVar46 = local_50;
                  uVar48 = (ulong)uVar30;
                  bVar49 = uVar43 < 0x800;
                  uVar43 = uVar43 * 2;
                } while (bVar49);
                p_00->range = uVar30;
                if (3 < uVar42) {
                  if (uVar42 < 0x80) {
                    iVar29 = (uVar27 >> 1) - 1;
                    uVar27 = (uVar27 & 1 | 2) << ((byte)iVar29 & 0x1f);
                    uVar23 = 1;
                    do {
                      uVar13 = uVar42 & 1;
                      uVar6 = pCVar46[(ulong)uVar27 + (ulong)uVar23];
                      uVar43 = (int)(uVar48 >> 0xb) * (uint)uVar6;
                      uVar15 = -uVar13 & uVar43;
                      pUVar1 = &(local_150->rc).low;
                      *pUVar1 = *pUVar1 + (ulong)uVar15;
                      uVar43 = (uVar43 & uVar13 - 1) + (((uint)uVar48 & -uVar13) - uVar15);
                      pCVar46[(ulong)uVar27 + (ulong)uVar23] =
                           (short)(((uVar13 - 1 & 0x7e1) - (uint)uVar6) + 0x1f >> 5) + uVar6;
                      if (uVar43 < 0x1000000) {
                        uVar43 = uVar43 * 0x100;
                        RangeEnc_ShiftLow(p_00);
                      }
                      uVar48 = (ulong)uVar43;
                      uVar42 = uVar42 >> 1;
                      uVar23 = uVar13 + uVar23 * 2;
                      iVar29 = iVar29 + -1;
                    } while (iVar29 != 0);
                    p_00->range = uVar43;
                    p = local_150;
                  }
                  else {
                    iVar29 = (uVar42 | 0xf) << (0x21U - (char)(uVar27 >> 1) & 0x1f);
                    do {
                      uVar27 = (uint)uVar48 >> 1;
                      pUVar1 = &(local_150->rc).low;
                      *pUVar1 = *pUVar1 + (ulong)(iVar29 >> 0x1f & uVar27);
                      if ((uint)uVar48 < 0x2000000) {
                        uVar27 = uVar27 << 8;
                        RangeEnc_ShiftLow(p_00);
                      }
                      pCVar8 = local_150;
                      uVar48 = (ulong)uVar27;
                      iVar29 = iVar29 * 2;
                    } while (iVar29 != -0x10000000);
                    uVar15 = uVar23 & 1;
                    uVar6 = local_150->posAlignEncoder[1];
                    uVar13 = (uVar27 >> 0xb) * (uint)uVar6;
                    uVar43 = -uVar15 & uVar13;
                    UVar21 = (ulong)uVar43 + (local_150->rc).low;
                    (local_150->rc).low = UVar21;
                    uVar27 = (uVar13 & uVar15 - 1) + ((uVar27 & -uVar15) - uVar43);
                    local_150->posAlignEncoder[1] =
                         (short)(((uVar15 - 1 & 0x7e1) - (uint)uVar6) + 0x1f >> 5) + uVar6;
                    if (uVar27 < 0x1000000) {
                      uVar27 = uVar27 * 0x100;
                      RangeEnc_ShiftLow(p_00);
                      UVar21 = (pCVar8->rc).low;
                    }
                    uVar15 = uVar15 | 2;
                    uVar43 = uVar23 >> 1 & 1;
                    uVar6 = pCVar8->posAlignEncoder[uVar15];
                    uVar13 = (uVar27 >> 0xb) * (uint)uVar6;
                    uVar23 = -uVar43 & uVar13;
                    UVar21 = uVar23 + UVar21;
                    (pCVar8->rc).low = UVar21;
                    uVar23 = (uVar13 & uVar43 - 1) + ((uVar27 & -uVar43) - uVar23);
                    pCVar8->posAlignEncoder[uVar15] =
                         (short)(((uVar43 - 1 & 0x7e1) - (uint)uVar6) + 0x1f >> 5) + uVar6;
                    if (uVar23 < 0x1000000) {
                      uVar23 = uVar23 * 0x100;
                      RangeEnc_ShiftLow(p_00);
                      UVar21 = (pCVar8->rc).low;
                    }
                    uVar43 = uVar43 + uVar15 * 2;
                    uVar15 = uVar42 >> 2 & 1;
                    uVar6 = pCVar8->posAlignEncoder[uVar43];
                    uVar13 = (uVar23 >> 0xb) * (uint)uVar6;
                    uVar27 = -uVar15 & uVar13;
                    UVar21 = uVar27 + UVar21;
                    (pCVar8->rc).low = UVar21;
                    uVar23 = (uVar13 & uVar15 - 1) + ((uVar23 & -uVar15) - uVar27);
                    pCVar8->posAlignEncoder[uVar43] =
                         (short)(((uVar15 - 1 & 0x7e1) - (uint)uVar6) + 0x1f >> 5) + uVar6;
                    if (uVar23 < 0x1000000) {
                      uVar23 = uVar23 * 0x100;
                      RangeEnc_ShiftLow(p_00);
                      UVar21 = (pCVar8->rc).low;
                    }
                    uVar13 = uVar42 >> 3 & 1;
                    uVar48 = (ulong)(uVar15 * 2 + uVar43 * 4);
                    uVar6 = *(ushort *)((long)pCVar8->posAlignEncoder + uVar48);
                    uVar42 = (uVar23 >> 0xb) * (uint)uVar6;
                    uVar27 = -uVar13;
                    uVar43 = uVar27 & uVar42;
                    (pCVar8->rc).low = uVar43 + UVar21;
                    uVar13 = uVar13 - 1;
                    uVar42 = (uVar42 & uVar13) + ((uVar23 & uVar27) - uVar43);
                    *(ushort *)((long)pCVar8->posAlignEncoder + uVar48) =
                         (short)(((uVar13 & 0x7e1) - (uint)uVar6) + 0x1f >> 5) + uVar6;
                    if (uVar42 < 0x1000000) {
                      uVar42 = uVar42 * 0x100;
                      RangeEnc_ShiftLow(p_00);
                    }
                    p_00->range = uVar42;
                    p = local_150;
                  }
                }
              }
            }
            UVar11 = uVar26 + uVar14;
            uVar48 = (ulong)UVar11;
            puVar2 = &p->additionalOffset;
            *puVar2 = *puVar2 - uVar14;
          } while (*puVar2 != 0);
          if (p->fastMode == 0) {
            if (0x3f < p->matchPriceCount) {
              FillAlignPrices(p);
              FillDistancesPrices(p);
              LenPriceEnc_UpdateTables(local_48,1 << ((byte)p->pb & 0x1f),local_98,local_168);
            }
            if (p->repLenEncCounter < 1) {
              p->repLenEncCounter = 0x40;
              LenPriceEnc_UpdateTables(local_58,1 << ((byte)p->pb & 0x1f),local_a0,local_168);
            }
          }
          UVar12 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
          if (UVar12 == 0) break;
          uVar26 = UVar11 - (int)local_b8;
          if (local_e4 == 0) {
            if (0x1ffff < uVar26) {
              p->nowPos64 = p->nowPos64 + (ulong)uVar26;
              if (p->result != 0) {
                return p->result;
              }
              if ((p->rc).res != 0) goto LAB_0019a733;
              if ((p->matchFinderBase).result == 0) {
                return 0;
              }
              goto LAB_0019a756;
            }
          }
          else if ((local_a4 <= uVar26 + 0x92c) ||
                  (local_40 <=
                   (p->rc).buf +
                   (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase) + 0x4000)) break;
        } while( true );
      }
      p->nowPos64 = p->nowPos64 + (ulong)(UVar11 - (int)local_b8);
LAB_0019ccae:
      SVar16 = Flush(p,UVar11);
      return SVar16;
    }
  }
  else {
LAB_0019a733:
    p->result = 9;
    if ((p->matchFinderBase).result == 0) {
      SVar16 = 9;
      goto LAB_0019a765;
    }
  }
LAB_0019a756:
  p->result = 8;
  SVar16 = 8;
LAB_0019a765:
  p->finished = 1;
  return SVar16;
LAB_0019c042:
  iVar29 = (int)local_120;
  uVar40 = local_170 & 0xffffffff;
LAB_0019c054:
  uVar44 = (ulong)(iVar29 - 1);
  uVar47 = local_60;
  uVar33 = uVar40;
  uVar45 = uVar40;
  if (local_60 == uVar40) goto LAB_0019cbde;
  goto LAB_0019b131;
}

Assistant:

Z7_NO_INLINE
static SRes LzmaEnc_CodeOneBlock(CLzmaEnc *p, UInt32 maxPackSize, UInt32 maxUnpackSize)
{
  UInt32 nowPos32, startPos32;
  if (p->needInit)
  {
    #ifndef Z7_ST
    if (p->mtMode)
    {
      RINOK(MatchFinderMt_InitMt(&p->matchFinderMt))
    }
    #endif
    p->matchFinder.Init(p->matchFinderObj);
    p->needInit = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p))

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0)
  {
    unsigned numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit_0(&p->rc, &p->isMatch[kState_Start][0]);
    // p->state = kLiteralNextStates[p->state];
    curByte = *(p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
  
  for (;;)
  {
    UInt32 dist;
    unsigned len, posState;
    UInt32 range, ttt, newBound;
    CLzmaProb *probs;
  
    if (p->fastMode)
      len = GetOptimumFast(p);
    else
    {
      unsigned oci = p->optCur;
      if (p->optEnd == oci)
        len = GetOptimum(p, nowPos32);
      else
      {
        const COptimal *opt = &p->opt[oci];
        len = opt->len;
        p->backRes = opt->dist;
        p->optCur = oci + 1;
      }
    }

    posState = (unsigned)nowPos32 & p->pbMask;
    range = p->rc.range;
    probs = &p->isMatch[p->state][posState];
    
    RC_BIT_PRE(&p->rc, probs)
    
    dist = p->backRes;

    #ifdef SHOW_STAT2
    printf("\n pos = %6X, len = %3u  pos = %6u", nowPos32, len, dist);
    #endif

    if (dist == MARK_LIT)
    {
      Byte curByte;
      const Byte *data;
      unsigned state;

      RC_BIT_0(&p->rc, probs)
      p->rc.range = range;
      data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
      probs = LIT_PROBS(nowPos32, *(data - 1));
      curByte = *data;
      state = p->state;
      p->state = kLiteralNextStates[state];
      if (IsLitState(state))
        LitEnc_Encode(&p->rc, probs, curByte);
      else
        LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0]));
    }
    else
    {
      RC_BIT_1(&p->rc, probs)
      probs = &p->isRep[p->state];
      RC_BIT_PRE(&p->rc, probs)
      
      if (dist < LZMA_NUM_REPS)
      {
        RC_BIT_1(&p->rc, probs)
        probs = &p->isRepG0[p->state];
        RC_BIT_PRE(&p->rc, probs)
        if (dist == 0)
        {
          RC_BIT_0(&p->rc, probs)
          probs = &p->isRep0Long[p->state][posState];
          RC_BIT_PRE(&p->rc, probs)
          if (len != 1)
          {
            RC_BIT_1_BASE(&p->rc, probs)
          }
          else
          {
            RC_BIT_0_BASE(&p->rc, probs)
            p->state = kShortRepNextStates[p->state];
          }
        }
        else
        {
          RC_BIT_1(&p->rc, probs)
          probs = &p->isRepG1[p->state];
          RC_BIT_PRE(&p->rc, probs)
          if (dist == 1)
          {
            RC_BIT_0_BASE(&p->rc, probs)
            dist = p->reps[1];
          }
          else
          {
            RC_BIT_1(&p->rc, probs)
            probs = &p->isRepG2[p->state];
            RC_BIT_PRE(&p->rc, probs)
            if (dist == 2)
            {
              RC_BIT_0_BASE(&p->rc, probs)
              dist = p->reps[2];
            }
            else
            {
              RC_BIT_1_BASE(&p->rc, probs)
              dist = p->reps[3];
              p->reps[3] = p->reps[2];
            }
            p->reps[2] = p->reps[1];
          }
          p->reps[1] = p->reps[0];
          p->reps[0] = dist;
        }

        RC_NORM(&p->rc)

        p->rc.range = range;

        if (len != 1)
        {
          LenEnc_Encode(&p->repLenProbs, &p->rc, len - LZMA_MATCH_LEN_MIN, posState);
          --p->repLenEncCounter;
          p->state = kRepNextStates[p->state];
        }
      }
      else
      {
        unsigned posSlot;
        RC_BIT_0(&p->rc, probs)
        p->rc.range = range;
        p->state = kMatchNextStates[p->state];

        LenEnc_Encode(&p->lenProbs, &p->rc, len - LZMA_MATCH_LEN_MIN, posState);
        // --p->lenEnc.counter;

        dist -= LZMA_NUM_REPS;
        p->reps[3] = p->reps[2];
        p->reps[2] = p->reps[1];
        p->reps[1] = p->reps[0];
        p->reps[0] = dist + 1;
        
        p->matchPriceCount++;
        GetPosSlot(dist, posSlot)
        // RcTree_Encode_PosSlot(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], posSlot);
        {
          UInt32 sym = (UInt32)posSlot + (1 << kNumPosSlotBits);
          range = p->rc.range;
          probs = p->posSlotEncoder[GetLenToPosState(len)];
          do
          {
            CLzmaProb *prob = probs + (sym >> kNumPosSlotBits);
            UInt32 bit = (sym >> (kNumPosSlotBits - 1)) & 1;
            sym <<= 1;
            RC_BIT(&p->rc, prob, bit)
          }
          while (sym < (1 << kNumPosSlotBits * 2));
          p->rc.range = range;
        }
        
        if (dist >= kStartPosModelIndex)
        {
          unsigned footerBits = ((posSlot >> 1) - 1);

          if (dist < kNumFullDistances)
          {
            unsigned base = ((2 | (posSlot & 1)) << footerBits);
            RcTree_ReverseEncode(&p->rc, p->posEncoders + base, footerBits, (unsigned)(dist /* - base */));
          }
          else
          {
            UInt32 pos2 = (dist | 0xF) << (32 - footerBits);
            range = p->rc.range;
            // RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
            /*
            do
            {
              range >>= 1;
              p->rc.low += range & (0 - ((dist >> --footerBits) & 1));
              RC_NORM(&p->rc)
            }
            while (footerBits > kNumAlignBits);
            */
            do
            {
              range >>= 1;
              p->rc.low += range & (0 - (pos2 >> 31));
              pos2 += pos2;
              RC_NORM(&p->rc)
            }
            while (pos2 != 0xF0000000);


            // RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);

            {
              unsigned m = 1;
              unsigned bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1; dist >>= 1; RC_BIT(&p->rc, p->posAlignEncoder + m, bit)  m = (m << 1) + bit;
              bit = dist & 1;             RC_BIT(&p->rc, p->posAlignEncoder + m, bit)
              p->rc.range = range;
              // p->alignPriceCount++;
            }
          }
        }
      }
    }

    nowPos32 += (UInt32)len;
    p->additionalOffset -= len;
    
    if (p->additionalOffset == 0)
    {
      UInt32 processed;

      if (!p->fastMode)
      {
        /*
        if (p->alignPriceCount >= 16) // kAlignTableSize
          FillAlignPrices(p);
        if (p->matchPriceCount >= 128)
          FillDistancesPrices(p);
        if (p->lenEnc.counter <= 0)
          LenPriceEnc_UpdateTables(&p->lenEnc, 1 << p->pb, &p->lenProbs, p->ProbPrices);
        */
        if (p->matchPriceCount >= 64)
        {
          FillAlignPrices(p);
          // { int y; for (y = 0; y < 100; y++) {
          FillDistancesPrices(p);
          // }}
          LenPriceEnc_UpdateTables(&p->lenEnc, (unsigned)1 << p->pb, &p->lenProbs, p->ProbPrices);
        }
        if (p->repLenEncCounter <= 0)
        {
          p->repLenEncCounter = REP_LEN_COUNT;
          LenPriceEnc_UpdateTables(&p->repLenEnc, (unsigned)1 << p->pb, &p->repLenProbs, p->ProbPrices);
        }
      }
    
      if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
        break;
      processed = nowPos32 - startPos32;
      
      if (maxPackSize)
      {
        if (processed + kNumOpts + 300 >= maxUnpackSize
            || RangeEnc_GetProcessed_sizet(&p->rc) + kPackReserve >= maxPackSize)
          break;
      }
      else if (processed >= (1 << 17))
      {
        p->nowPos64 += nowPos32 - startPos32;
        return CheckErrors(p);
      }
    }
  }

  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}